

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGccDepfileReader.cxx
# Opt level: O2

void anon_unknown.dwarf_76796::dump(char *label,cmGccDepfileContent *dfc)

{
  pointer pcVar1;
  pointer pbVar2;
  ostream *poVar3;
  cmGccStyleDependency *entry;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer pbVar5;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,label);
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar1 = (dfc->super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pcVar4 = (dfc->
                super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>).
                _M_impl.super__Vector_impl_data._M_start; pcVar4 != pcVar1; pcVar4 = pcVar4 + 1) {
    pbVar5 = (pcVar4->rules).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar5 != (pcVar4->rules).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      poVar3 = (ostream *)&std::cerr;
      while( true ) {
        std::operator<<(poVar3,(string *)pbVar5);
        pbVar5 = pbVar5 + 1;
        if (pbVar5 == (pcVar4->rules).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
        poVar3 = std::operator<<((ostream *)&std::cerr,"  ");
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,": ");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    pbVar2 = (pcVar4->paths).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = (pcVar4->paths).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1)
    {
      poVar3 = std::operator<<((ostream *)&std::cerr,"    ");
      poVar3 = std::operator<<(poVar3,(string *)pbVar5);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  return;
}

Assistant:

void dump(const char* label, const cmGccDepfileContent& dfc)
{
  std::cerr << label << std::endl;
  for (const auto& entry : dfc) {
    auto rit = entry.rules.cbegin();
    if (rit != entry.rules.cend()) {
      std::cerr << *rit;
      for (++rit; rit != entry.rules.cend(); ++rit) {
        std::cerr << "  " << *rit;
      }
      std::cerr << ": " << std::endl;
    }
    for (const auto& path : entry.paths) {
      std::cerr << "    " << path << std::endl;
    }
  }
}